

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

int find_conflict_base(int cbase)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Yshort *pYVar8;
  
  uVar4 = (ulong)(uint)cbase;
  if (0 < cbase) {
    uVar7 = 0;
    pYVar8 = conflicts;
    do {
      pYVar8 = pYVar8 + 1;
      if (nconflicts <= cbase) {
LAB_00111f24:
        return (int)uVar7;
      }
      bVar3 = nconflicts - cbase != 0 && cbase <= nconflicts;
      if (conflicts[uVar7] == conflicts[uVar4]) {
        lVar6 = 0;
        do {
          if ((ulong)(uint)(nconflicts - cbase) - 1 == lVar6) goto LAB_00111f24;
          piVar2 = pYVar8 + lVar6;
          lVar1 = lVar6 + 1;
          lVar5 = lVar6 + 1;
          lVar6 = lVar1;
        } while (*piVar2 == conflicts[uVar4 + lVar5]);
        bVar3 = (int)lVar1 + cbase < nconflicts;
      }
      if (!bVar3) goto LAB_00111f24;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  return cbase;
}

Assistant:

int find_conflict_base(int cbase)
{
    int i,j;

    for (i=0; i<cbase; i++) {
	for (j=0; j+cbase < nconflicts; j++) {
	    if (conflicts[i+j] != conflicts[cbase+j])
		break; }
	if (j+cbase >= nconflicts)
	    return i; }
    return cbase;
}